

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O3

void __thiscall Fl_Counter::draw(Fl_Counter *this)

{
  byte bVar1;
  uchar uVar2;
  int X;
  Fl_Boxtype FVar3;
  int iVar4;
  Fl_Color FVar5;
  Fl_Boxtype FVar6;
  Fl_Boxtype t;
  int X_00;
  int W;
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char str [128];
  int local_104;
  int local_100;
  int local_fc;
  int local_d0;
  Fl_Boxtype local_c8;
  Fl_Boxtype FStack_c4;
  Fl_Boxtype FStack_c0;
  char local_b8 [136];
  
  bVar1 = (this->super_Fl_Valuator).super_Fl_Widget.box_;
  bVar8 = 1 < bVar1;
  FVar6 = (Fl_Boxtype)bVar1;
  FVar3 = FL_DOWN_BOX;
  if (bVar1 != 2) {
    FVar3 = FVar6;
  }
  t = FL_THIN_DOWN_BOX;
  if (FVar3 != FL_THIN_UP_BOX) {
    t = FVar3;
  }
  iVar7 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  if ((this->super_Fl_Valuator).super_Fl_Widget.type_ == '\0') {
    W = (iVar7 * 0xf) / 100;
    X = (this->super_Fl_Valuator).super_Fl_Widget.x_;
    local_d0 = W + X;
    X_00 = X + W * 2;
    iVar4 = W * 4;
    local_fc = X + iVar7 + W * -2;
    local_100 = (X + iVar7) - W;
    local_104 = W;
  }
  else {
    W = iVar7 / 5;
    local_d0 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
    X_00 = local_d0 + W;
    iVar4 = W * 2;
    local_fc = (local_d0 + iVar7) - W;
    local_100 = 0;
    X = 0;
    local_104 = 0;
  }
  uVar2 = this->mouseobj;
  iVar7 = iVar7 - iVar4;
  Fl_Widget::draw_box((Fl_Widget *)this,t,X_00,(this->super_Fl_Valuator).super_Fl_Widget.y_,iVar7,
                      (this->super_Fl_Valuator).super_Fl_Widget.h_,7);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)*(uint *)&(this->super_Fl_Valuator).field_0xa4,
             (ulong)(uint)this->textsize_);
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  FVar5 = this->textcolor_;
  if (iVar4 == 0) {
    FVar5 = fl_inactive(FVar5);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
  (*(this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_b8);
  fl_draw(local_b8,X_00,(this->super_Fl_Valuator).super_Fl_Widget.y_,iVar7,
          (this->super_Fl_Valuator).super_Fl_Widget.h_,0,(Fl_Image *)0x0,1);
  if ((Fl_Counter *)Fl::focus_ == this) {
    Fl_Widget::draw_focus
              ((Fl_Widget *)this,t,X_00,(this->super_Fl_Valuator).super_Fl_Widget.y_,iVar7,
               (this->super_Fl_Valuator).super_Fl_Widget.h_);
  }
  if ((char)(this->super_Fl_Valuator).super_Fl_Widget.damage_ < '\0') {
    auVar10._1_3_ = 0;
    auVar10[0] = bVar8;
    auVar10[4] = bVar8;
    auVar10._5_3_ = 0;
    auVar10[8] = bVar8;
    auVar10._9_3_ = 0;
    auVar10[0xc] = bVar8;
    auVar10._13_3_ = 0;
    auVar9._0_4_ = -(uint)(uVar2 == '\x01');
    auVar9._4_4_ = -(uint)(uVar2 == '\x02');
    auVar9._8_4_ = -(uint)(uVar2 == '\x03');
    auVar9._12_4_ = -(uint)(uVar2 == '\x04');
    auVar10 = auVar9 & auVar10 & _DAT_0021b770;
    iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar5 = (this->super_Fl_Valuator).super_Fl_Widget.label_.color;
    if (iVar7 == 0) {
      FVar5 = fl_inactive(FVar5);
    }
    local_c8 = auVar10._0_4_;
    FStack_c4 = auVar10._4_4_;
    FStack_c0 = auVar10._8_4_;
    if ((this->super_Fl_Valuator).super_Fl_Widget.type_ == '\0') {
      Fl_Widget::draw_box((Fl_Widget *)this,FVar6 | local_c8,X,
                          (this->super_Fl_Valuator).super_Fl_Widget.y_,local_104,
                          (this->super_Fl_Valuator).super_Fl_Widget.h_,
                          (this->super_Fl_Valuator).super_Fl_Widget.color_);
      fl_draw_symbol("@-4<<",X,(this->super_Fl_Valuator).super_Fl_Widget.y_,local_104,
                     (this->super_Fl_Valuator).super_Fl_Widget.h_,FVar5);
    }
    Fl_Widget::draw_box((Fl_Widget *)this,FVar6 | FStack_c4,local_d0,
                        (this->super_Fl_Valuator).super_Fl_Widget.y_,W,
                        (this->super_Fl_Valuator).super_Fl_Widget.h_,
                        (this->super_Fl_Valuator).super_Fl_Widget.color_);
    fl_draw_symbol("@-4<",local_d0,(this->super_Fl_Valuator).super_Fl_Widget.y_,W,
                   (this->super_Fl_Valuator).super_Fl_Widget.h_,FVar5);
    Fl_Widget::draw_box((Fl_Widget *)this,FVar6 | FStack_c0,local_fc,
                        (this->super_Fl_Valuator).super_Fl_Widget.y_,W,
                        (this->super_Fl_Valuator).super_Fl_Widget.h_,
                        (this->super_Fl_Valuator).super_Fl_Widget.color_);
    fl_draw_symbol("@-4>",local_fc,(this->super_Fl_Valuator).super_Fl_Widget.y_,W,
                   (this->super_Fl_Valuator).super_Fl_Widget.h_,FVar5);
    if ((this->super_Fl_Valuator).super_Fl_Widget.type_ == '\0') {
      Fl_Widget::draw_box((Fl_Widget *)this,FVar6 | FStack_c4,local_100,
                          (this->super_Fl_Valuator).super_Fl_Widget.y_,local_104,
                          (this->super_Fl_Valuator).super_Fl_Widget.h_,
                          (this->super_Fl_Valuator).super_Fl_Widget.color_);
      fl_draw_symbol("@-4>>",local_100,(this->super_Fl_Valuator).super_Fl_Widget.y_,local_104,
                     (this->super_Fl_Valuator).super_Fl_Widget.h_,FVar5);
    }
  }
  return;
}

Assistant:

void Fl_Counter::draw() {
  int i; Fl_Boxtype boxtype[5];
  Fl_Color selcolor;

  boxtype[0] = box();
  if (boxtype[0] == FL_UP_BOX) boxtype[0] = FL_DOWN_BOX;
  if (boxtype[0] == FL_THIN_UP_BOX) boxtype[0] = FL_THIN_DOWN_BOX;
  for (i=1; i<5; i++)
    if (mouseobj == i)
      boxtype[i] = fl_down(box());
    else
      boxtype[i] = box();

  int xx[5], ww[5];
  if (type() == FL_NORMAL_COUNTER) {
    int W = w()*15/100;
    xx[1] = x();	 ww[1] = W;
    xx[2] = x()+1*W;     ww[2] = W;
    xx[0] = x()+2*W;     ww[0] = w()-4*W;
    xx[3] = x()+w()-2*W; ww[3] = W;
    xx[4] = x()+w()-1*W; ww[4] = W;
  } else {
    int W = w()*20/100;
    xx[1] = 0;	         ww[1] = 0;
    xx[2] = x();	 ww[2] = W;
    xx[0] = x()+W;	 ww[0] = w()-2*W;
    xx[3] = x()+w()-1*W; ww[3] = W;
    xx[4] = 0;	         ww[4] = 0;
  }

  draw_box(boxtype[0], xx[0], y(), ww[0], h(), FL_BACKGROUND2_COLOR);
  fl_font(textfont(), textsize());
  fl_color(active_r() ? textcolor() : fl_inactive(textcolor()));
  char str[128]; format(str);
  fl_draw(str, xx[0], y(), ww[0], h(), FL_ALIGN_CENTER);
  if (Fl::focus() == this) draw_focus(boxtype[0], xx[0], y(), ww[0], h());
  if (!(damage()&FL_DAMAGE_ALL)) return; // only need to redraw text

  if (active_r())
    selcolor = labelcolor();
  else
    selcolor = fl_inactive(labelcolor());

  if (type() == FL_NORMAL_COUNTER) {
    draw_box(boxtype[1], xx[1], y(), ww[1], h(), color());
    fl_draw_symbol("@-4<<", xx[1], y(), ww[1], h(), selcolor);
  }
  draw_box(boxtype[2], xx[2], y(), ww[2], h(), color());
  fl_draw_symbol("@-4<",  xx[2], y(), ww[2], h(), selcolor);
  draw_box(boxtype[3], xx[3], y(), ww[3], h(), color());
  fl_draw_symbol("@-4>",  xx[3], y(), ww[3], h(), selcolor);
  if (type() == FL_NORMAL_COUNTER) {
    draw_box(boxtype[4], xx[4], y(), ww[4], h(), color());
    fl_draw_symbol("@-4>>", xx[4], y(), ww[4], h(), selcolor);
  }
}